

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btInternalEdge>::push_back
          (btAlignedObjectArray<btInternalEdge> *this,btInternalEdge *_Val)

{
  btInternalEdge *pbVar1;
  undefined2 uVar2;
  int iVar3;
  int iVar4;
  btAlignedObjectArray<btInternalEdge> *in_RSI;
  btAlignedObjectArray<btInternalEdge> *in_RDI;
  int sz;
  int iVar5;
  
  iVar3 = size(in_RDI);
  iVar5 = iVar3;
  iVar4 = capacity(in_RDI);
  if (iVar3 == iVar4) {
    iVar3 = size(in_RDI);
    allocSize(in_RDI,iVar3);
    reserve(in_RSI,iVar5);
  }
  pbVar1 = in_RDI->m_data;
  iVar5 = in_RDI->m_size;
  uVar2 = *(undefined2 *)&in_RSI->field_0x2;
  pbVar1[iVar5].m_face0 = *(undefined2 *)&in_RSI->field_0x0;
  pbVar1[iVar5].m_face1 = uVar2;
  in_RDI->m_size = in_RDI->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}